

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
r_code::list<unsigned_short>::push_back_new_cell(list<unsigned_short> *this,unsigned_short *t)

{
  value_type local_20;
  
  local_20.data = *t;
  local_20.next = -1;
  local_20.prev = this->used_cells_tail;
  std::
  vector<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>::
  push_back(&this->cells,&local_20);
  this->used_cells_tail =
       ((long)(this->cells).
              super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->cells).
             super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18 + -1;
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }